

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void Ppmd8_Construct(CPpmd8 *p)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  p->Base = (Byte *)0x0;
  uVar4 = 0;
  for (uVar2 = 0; uVar2 != 0x26; uVar2 = uVar2 + 1) {
    iVar5 = ((uint)(uVar2 >> 2) & 0x3fffffff) + 1;
    if (0xb < uVar2) {
      iVar5 = 4;
    }
    iVar8 = 0;
    uVar6 = uVar4;
    do {
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      p->Units2Indx[uVar7] = (Byte)uVar2;
      iVar8 = iVar8 + -1;
    } while (-iVar5 != iVar8);
    p->Indx2Units[uVar2] = (char)uVar4 - (char)iVar8;
    uVar4 = uVar6;
  }
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  p->NS2BSIndx[2] = '\x04';
  p->NS2BSIndx[3] = '\x04';
  p->NS2BSIndx[4] = '\x04';
  p->NS2BSIndx[5] = '\x04';
  p->NS2BSIndx[6] = '\x04';
  p->NS2BSIndx[7] = '\x04';
  p->NS2BSIndx[8] = '\x04';
  p->NS2BSIndx[9] = '\x04';
  p->NS2BSIndx[10] = '\x04';
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    p->NS2Indx[lVar3] = (Byte)lVar3;
  }
  iVar5 = 5;
  iVar8 = 1;
  for (lVar3 = -0xff; lVar3 != 0; lVar3 = lVar3 + 1) {
    *(Byte *)((long)(p->See + -1) + lVar3 + 0x7c) = (Byte)iVar5;
    iVar1 = iVar8 + -1;
    iVar8 = iVar1;
    if (iVar1 == 0) {
      iVar8 = iVar5 + -3;
    }
    iVar5 = (uint)(iVar1 == 0) + iVar5;
  }
  return;
}

Assistant:

void Ppmd8_Construct(CPpmd8 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while (--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 5; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 260; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 4;
  }
}